

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<pstore::small_vector<int,8ul>,void>
               (small_vector<int,_8UL> *container,ostream *os)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int *value;
  
  std::operator<<(os,'{');
  uVar1 = container->elements_;
  value = container->buffer_;
  lVar3 = uVar1 * 4;
  lVar2 = 0;
  do {
    if (lVar3 == 0) {
      if ((uVar1 & 0x3fffffffffffffff) != 0) {
LAB_0015269c:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_0015269c;
    }
    std::operator<<(os,' ');
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<int,void,std::ostream&>(value,os);
    lVar2 = lVar2 + 1;
    value = value + 1;
    lVar3 = lVar3 + -4;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }